

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O0

void __thiscall
icu_63::RBBISetBuilder::addValToSet(RBBISetBuilder *this,RBBINode *usetNode,uint32_t val)

{
  RBBINode *this_00;
  RBBINode *pRVar1;
  RBBINode *local_78;
  RBBINode *local_60;
  RBBINode *orNode;
  RBBINode *leafNode;
  uint32_t val_local;
  RBBINode *usetNode_local;
  RBBISetBuilder *this_local;
  
  pRVar1 = usetNode;
  this_00 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)usetNode);
  local_60 = (RBBINode *)0x0;
  if (this_00 != (RBBINode *)0x0) {
    pRVar1 = (RBBINode *)0x3;
    RBBINode::RBBINode(this_00,leafChar);
    local_60 = this_00;
  }
  if (local_60 == (RBBINode *)0x0) {
    *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    local_60->fVal = val & 0xffff;
    if (usetNode->fLeftChild == (RBBINode *)0x0) {
      usetNode->fLeftChild = local_60;
      local_60->fParent = usetNode;
    }
    else {
      pRVar1 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)pRVar1);
      local_78 = (RBBINode *)0x0;
      if (pRVar1 != (RBBINode *)0x0) {
        RBBINode::RBBINode(pRVar1,opOr);
        local_78 = pRVar1;
      }
      if (local_78 == (RBBINode *)0x0) {
        *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        local_78->fLeftChild = usetNode->fLeftChild;
        local_78->fRightChild = local_60;
        local_78->fLeftChild->fParent = local_78;
        local_78->fRightChild->fParent = local_78;
        usetNode->fLeftChild = local_78;
        local_78->fParent = usetNode;
      }
    }
  }
  return;
}

Assistant:

void  RBBISetBuilder::addValToSet(RBBINode *usetNode, uint32_t val) {
    RBBINode *leafNode = new RBBINode(RBBINode::leafChar);
    if (leafNode == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    leafNode->fVal = (unsigned short)val;
    if (usetNode->fLeftChild == NULL) {
        usetNode->fLeftChild = leafNode;
        leafNode->fParent    = usetNode;
    } else {
        // There are already input symbols present for this set.
        // Set up an OR node, with the previous stuff as the left child
        //   and the new value as the right child.
        RBBINode *orNode = new RBBINode(RBBINode::opOr);
        if (orNode == NULL) {
            *fStatus = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        orNode->fLeftChild  = usetNode->fLeftChild;
        orNode->fRightChild = leafNode;
        orNode->fLeftChild->fParent  = orNode;
        orNode->fRightChild->fParent = orNode;
        usetNode->fLeftChild = orNode;
        orNode->fParent = usetNode;
    }
}